

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
          (ParserRefImpl<Catch::Clara::Opt> *this,shared_ptr<Catch::Clara::Detail::BoundRef> *ref)

{
  shared_ptr<Catch::Clara::Detail::BoundRef> *ref_local;
  ParserRefImpl<Catch::Clara::Opt> *this_local;
  
  ComposableParserImpl<Catch::Clara::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::Clara::Opt>);
  (this->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00500410;
  this->m_optionality = Optional;
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::shared_ptr(&this->m_ref,ref);
  std::__cxx11::string::string((string *)&this->m_hint);
  std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

explicit ParserRefImpl( std::shared_ptr<BoundRef> const& ref ):
                    m_ref( ref ) {}